

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tls_connection.cc
# Opt level: O2

void __thiscall AliTlsConnection::Close(AliTlsConnection *this)

{
  mbedtls_net_free(&this->server_fd_);
  mbedtls_ssl_free(&this->ssl_);
  mbedtls_ssl_config_free(&this->conf_);
  mbedtls_x509_crt_free(&this->cacert_);
  mbedtls_ctr_drbg_free(&this->ctr_drbg_);
  mbedtls_entropy_free(&this->entropy_);
  ~AliTlsConnection(this);
  operator_delete(this,0xb08);
  return;
}

Assistant:

void AliTlsConnection::Close() {
  mbedtls_net_free( &server_fd_ );
  mbedtls_ssl_free( &ssl_ );
  mbedtls_ssl_config_free( &conf_ );
  mbedtls_x509_crt_free( &cacert_ );
  mbedtls_ctr_drbg_free( &ctr_drbg_ );
  mbedtls_entropy_free( &entropy_ );
  delete this;
}